

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Batchnorm.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeBatchnorm(ConvertLayerParameters layerParameters)

{
  BatchNormParameter *this;
  bool bVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  int32 iVar5;
  uint uVar6;
  string *psVar7;
  LayerParameter *pLVar8;
  string *__rhs;
  ScaleParameter *this_00;
  LayerParameter *this_01;
  NeuralNetworkLayer *this_02;
  BlobProto *pBVar9;
  RepeatedField<float> *pRVar10;
  WeightParams *pWVar11;
  float *pfVar12;
  float value;
  NetParameter *in_stack_00000008;
  float local_530;
  float local_344;
  float local_340;
  float local_33c;
  float local_338;
  int local_334;
  float local_330;
  int i;
  float local_328;
  float local_324;
  RepeatedField<float> *local_320;
  RepeatedField<float> *betaWrite;
  RepeatedField<float> *gammaWrite;
  RepeatedField<float> *varianceWrite;
  RepeatedField<float> *meanWrite;
  RepeatedField<float> variance;
  RepeatedField<float> mean;
  float multiplicativeScale;
  float scale;
  allocator local_2a9;
  string local_2a8;
  allocator local_281;
  string local_280;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  int local_194;
  int local_190;
  int varianceLength;
  int C;
  allocator local_161;
  string local_160;
  BatchNormParameter *local_140;
  BatchNormParameter *caffeLayerParamsBN;
  BatchnormLayerParams *specLayerParams;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  NeuralNetworkLayer *specLayer;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite;
  LayerParameter *caffeScaleLayerWeights;
  int layerIdWeightsScale;
  ScaleParameter *caffeLayerParamsScale;
  LayerParameter *caffeScaleLayer;
  RepeatedField<float> beta;
  RepeatedField<float> gamma;
  string TopName;
  string local_88;
  allocator local_51;
  string local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_30;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayerWeights;
  LayerParameter *pLStack_18;
  int layerIdWeights;
  LayerParameter *caffeLayer;
  int layerId;
  bool fuseScale;
  
  caffeLayer._7_1_ = 0;
  caffeLayer._0_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  pLStack_18 = caffe::NetParameter::layer(in_stack_00000008,(int)caffeLayer);
  caffeLayerWeights._4_4_ =
       getLayerIndex(pLStack_18,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)layerParameters.mappingDataBlobNames);
  mappingDataBlobNames =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)caffe::NetParameter::layer(layerParameters.prototxt,caffeLayerWeights._4_4_);
  local_30 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)layerParameters._24_8_;
  iVar3 = caffe::LayerParameter::bottom_size(pLStack_18);
  if ((iVar3 != 1) || (iVar3 = caffe::LayerParameter::top_size(pLStack_18), iVar3 != 1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Must have 1 input and 1 output",&local_51);
    psVar7 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_88,"BatchNorm",(allocator *)(TopName.field_2._M_local_buf + 0xf));
    errorInCaffeProto(&local_50,psVar7,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)(TopName.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  psVar7 = caffe::LayerParameter::top_abi_cxx11_(pLStack_18,0);
  std::__cxx11::string::string((string *)&gamma.rep_,(string *)psVar7);
  google::protobuf::RepeatedField<float>::RepeatedField((RepeatedField<float> *)&beta.rep_);
  google::protobuf::RepeatedField<float>::RepeatedField((RepeatedField<float> *)&caffeScaleLayer);
  iVar3 = (int)caffeLayer;
  iVar4 = caffe::NetParameter::layer_size(in_stack_00000008);
  if (iVar3 < iVar4 + -1) {
    pLVar8 = caffe::NetParameter::layer(in_stack_00000008,(int)caffeLayer + 1);
    psVar7 = caffe::LayerParameter::type_abi_cxx11_(pLVar8);
    bVar1 = std::operator==(psVar7,"Scale");
    if (bVar1) {
      pLVar8 = caffe::NetParameter::layer(in_stack_00000008,(int)caffeLayer + 1);
      iVar3 = caffe::LayerParameter::bottom_size(pLVar8);
      if ((iVar3 == 1) && (iVar3 = caffe::LayerParameter::top_size(pLVar8), iVar3 == 1)) {
        psVar7 = caffe::LayerParameter::bottom_abi_cxx11_(pLVar8,0);
        __rhs = caffe::LayerParameter::top_abi_cxx11_(pLStack_18,0);
        _Var2 = std::operator==(psVar7,__rhs);
        if (_Var2) {
          this_00 = caffe::LayerParameter::scale_param(pLVar8);
          iVar5 = caffe::ScaleParameter::axis(this_00);
          if ((((iVar5 == 1) || (iVar5 = caffe::ScaleParameter::axis(this_00), iVar5 == -3)) &&
              (iVar5 = caffe::ScaleParameter::num_axes(this_00), iVar5 == 1)) &&
             (bVar1 = caffe::ScaleParameter::bias_term(this_00), bVar1)) {
            iVar3 = getLayerIndex(pLVar8,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                          *)layerParameters.mappingDataBlobNames);
            this_01 = caffe::NetParameter::layer(layerParameters.prototxt,iVar3);
            iVar3 = caffe::LayerParameter::blobs_size(this_01);
            if (iVar3 == 2) {
              pBVar9 = caffe::LayerParameter::blobs(this_01,0);
              iVar3 = caffe::BlobProto::data_size(pBVar9);
              pBVar9 = caffe::LayerParameter::blobs(this_01,1);
              iVar4 = caffe::BlobProto::data_size(pBVar9);
              pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
              uVar6 = caffe::BlobProto::data_size(pBVar9);
              if ((iVar3 == iVar4) == uVar6) {
                caffeLayer._7_1_ = 1;
                psVar7 = caffe::LayerParameter::top_abi_cxx11_(pLVar8,0);
                std::__cxx11::string::operator=((string *)&gamma.rep_,(string *)psVar7);
                pBVar9 = caffe::LayerParameter::blobs(this_01,0);
                pRVar10 = caffe::BlobProto::data(pBVar9);
                google::protobuf::RepeatedField<float>::operator=
                          ((RepeatedField<float> *)&beta.rep_,pRVar10);
                pBVar9 = caffe::LayerParameter::blobs(this_01,1);
                pRVar10 = caffe::BlobProto::data(pBVar9);
                google::protobuf::RepeatedField<float>::operator=
                          ((RepeatedField<float> *)&caffeScaleLayer,pRVar10);
                *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl =
                     *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl + 1;
              }
            }
          }
        }
      }
    }
  }
  this_02 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                       layerParameters.protoweights);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&top.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&specLayerParams);
  psVar7 = caffe::LayerParameter::bottom_abi_cxx11_(pLStack_18,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&top.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&specLayerParams,(value_type *)&gamma.rep_);
  psVar7 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
  convertCaffeMetadata
            (psVar7,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&top.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&specLayerParams,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
             layerParameters.protoweights,local_30);
  caffeLayerParamsBN =
       (BatchNormParameter *)CoreML::Specification::NeuralNetworkLayer::mutable_batchnorm(this_02);
  local_140 = caffe::LayerParameter::batch_norm_param(pLStack_18);
  iVar3 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames);
  if (iVar3 != 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_160,"Must have 3 weight blobs for mean, variance and scale",
               &local_161);
    psVar7 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&C,"BatchNorm",(allocator *)((long)&varianceLength + 3));
    errorInCaffeProto(&local_160,psVar7,(string *)&C);
    std::__cxx11::string::~string((string *)&C);
    std::allocator<char>::~allocator((allocator<char> *)((long)&varianceLength + 3));
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
  }
  caffe::BatchNormParameter::use_global_stats(local_140);
  pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
  local_190 = caffe::BlobProto::data_size(pBVar9);
  pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,1);
  local_194 = caffe::BlobProto::data_size(pBVar9);
  if (local_190 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,"Empty mean vector blob",&local_1b9);
    psVar7 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e0,"BatchNorm",&local_1e1);
    errorInCaffeProto(&local_1b8,psVar7,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  }
  if (local_194 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,"Empty variance vector blob",&local_209);
    psVar7 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"BatchNorm",&local_231);
    errorInCaffeProto(&local_208,psVar7,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
  }
  if (local_194 != local_190) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_258,"Lengths of mean/variance vectors do not match",&local_259);
    psVar7 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_280,"BatchNorm",&local_281);
    errorInCaffeProto(&local_258,psVar7,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
  }
  pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,2);
  iVar3 = caffe::BlobProto::data_size(pBVar9);
  if (iVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a8,"Empty scale factor blob",&local_2a9);
    psVar7 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&scale,"BatchNorm",(allocator *)((long)&multiplicativeScale + 3));
    errorInCaffeProto(&local_2a8,psVar7,(string *)&scale);
    std::__cxx11::string::~string((string *)&scale);
    std::allocator<char>::~allocator((allocator<char> *)((long)&multiplicativeScale + 3));
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  }
  this = caffeLayerParamsBN;
  value = caffe::BatchNormParameter::eps(local_140);
  CoreML::Specification::BatchnormLayerParams::set_epsilon((BatchnormLayerParams *)this,value);
  if (-1 < local_190) {
    CoreML::Specification::BatchnormLayerParams::set_channels
              ((BatchnormLayerParams *)caffeLayerParamsBN,(long)local_190);
    pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,2);
    local_530 = caffe::BlobProto::data(pBVar9,0);
    if (1e-05 <= local_530) {
      local_530 = 1.0 / local_530;
    }
    else {
      local_530 = 0.0;
    }
    pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pRVar10 = caffe::BlobProto::data(pBVar9);
    google::protobuf::RepeatedField<float>::RepeatedField
              ((RepeatedField<float> *)&variance.rep_,pRVar10);
    pBVar9 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,1);
    pRVar10 = caffe::BlobProto::data(pBVar9);
    google::protobuf::RepeatedField<float>::RepeatedField
              ((RepeatedField<float> *)&meanWrite,pRVar10);
    pWVar11 = CoreML::Specification::BatchnormLayerParams::mutable_mean
                        ((BatchnormLayerParams *)caffeLayerParamsBN);
    varianceWrite = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar11);
    pWVar11 = CoreML::Specification::BatchnormLayerParams::mutable_variance
                        ((BatchnormLayerParams *)caffeLayerParamsBN);
    gammaWrite = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar11);
    pWVar11 = CoreML::Specification::BatchnormLayerParams::mutable_gamma
                        ((BatchnormLayerParams *)caffeLayerParamsBN);
    betaWrite = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar11);
    pWVar11 = CoreML::Specification::BatchnormLayerParams::mutable_beta
                        ((BatchnormLayerParams *)caffeLayerParamsBN);
    local_320 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar11);
    local_324 = 0.0;
    google::protobuf::RepeatedField<float>::Resize(varianceWrite,local_190,&local_324);
    local_328 = 0.0;
    google::protobuf::RepeatedField<float>::Resize(gammaWrite,local_190,&local_328);
    i = 0;
    google::protobuf::RepeatedField<float>::Resize(betaWrite,local_190,(float *)&i);
    local_330 = 0.0;
    google::protobuf::RepeatedField<float>::Resize(local_320,local_190,&local_330);
    for (local_334 = 0; pRVar10 = varianceWrite, iVar3 = local_334, local_334 < local_190;
        local_334 = local_334 + 1) {
      pfVar12 = google::protobuf::RepeatedField<float>::operator[]
                          ((RepeatedField<float> *)&variance.rep_,local_334);
      local_338 = *pfVar12 * local_530;
      google::protobuf::RepeatedField<float>::Set(pRVar10,iVar3,&local_338);
      pRVar10 = gammaWrite;
      iVar3 = local_334;
      pfVar12 = google::protobuf::RepeatedField<float>::operator[]
                          ((RepeatedField<float> *)&meanWrite,local_334);
      local_33c = *pfVar12 * local_530;
      google::protobuf::RepeatedField<float>::Set(pRVar10,iVar3,&local_33c);
      pRVar10 = betaWrite;
      iVar3 = local_334;
      if ((caffeLayer._7_1_ & 1) == 0) {
        local_340 = 1.0;
        google::protobuf::RepeatedField<float>::Set(betaWrite,local_334,&local_340);
        local_344 = 0.0;
        google::protobuf::RepeatedField<float>::Set(local_320,local_334,&local_344);
      }
      else {
        pfVar12 = google::protobuf::RepeatedField<float>::operator[]
                            ((RepeatedField<float> *)&beta.rep_,local_334);
        google::protobuf::RepeatedField<float>::Set(pRVar10,iVar3,pfVar12);
        pRVar10 = local_320;
        iVar3 = local_334;
        pfVar12 = google::protobuf::RepeatedField<float>::operator[]
                            ((RepeatedField<float> *)&caffeScaleLayer,local_334);
        google::protobuf::RepeatedField<float>::Set(pRVar10,iVar3,pfVar12);
      }
    }
    google::protobuf::RepeatedField<float>::~RepeatedField((RepeatedField<float> *)&meanWrite);
    google::protobuf::RepeatedField<float>::~RepeatedField((RepeatedField<float> *)&variance.rep_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&specLayerParams);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&top.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    google::protobuf::RepeatedField<float>::~RepeatedField((RepeatedField<float> *)&caffeScaleLayer)
    ;
    google::protobuf::RepeatedField<float>::~RepeatedField((RepeatedField<float> *)&beta.rep_);
    std::__cxx11::string::~string((string *)&gamma.rep_);
    return;
  }
  __assert_fail("C >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Batchnorm.cpp"
                ,0x80,
                "void CoreMLConverter::convertCaffeBatchnorm(CoreMLConverter::ConvertLayerParameters)"
               );
}

Assistant:

void CoreMLConverter::convertCaffeBatchnorm(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    /*
     If Batchnorm layer is followed by a Scale layer, we try to fuse the two into 1 CoreML Batchnorm layer (its more efficient).
     */
    
    bool fuseScale = false;
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),"BatchNorm");
    }
    
    std::string TopName = caffeLayer.top(0);
    ::google::protobuf::RepeatedField<float> gamma;
    ::google::protobuf::RepeatedField<float> beta;
    /*
     Check whether Scale layer is to be fused: several conditions must be satisfied
     */
    //check whether the current BN is not the last layer and that the next layer is a "Scale" layer
    if (layerId < layerParameters.prototxt.layer_size()-1 && layerParameters.prototxt.layer(layerId+1).type() == "Scale"){
        const caffe::LayerParameter& caffeScaleLayer = layerParameters.prototxt.layer(layerId+1);
        
        //check whether the Scale layer has 1 bottom and top. Its bottom must be same as BN layer's top,
        //so that we know for sure that they are connected.
        if (caffeScaleLayer.bottom_size() == 1 && caffeScaleLayer.top_size() == 1 &&
            caffeScaleLayer.bottom(0) == caffeLayer.top(0)){
            
            const caffe::ScaleParameter& caffeLayerParamsScale = caffeScaleLayer.scale_param();
            
            //check that the Scale layer only applies scale to the channel axis and that it also includes the bias term.
            if ((caffeLayerParamsScale.axis() == 1 || caffeLayerParamsScale.axis() == -3) &&
                caffeLayerParamsScale.num_axes() == 1 && caffeLayerParamsScale.bias_term()){
                
                int layerIdWeightsScale = CoreMLConverter::getLayerIndex(caffeScaleLayer,layerParameters.mapCaffeLayerNamesToIndex);
                const caffe::LayerParameter& caffeScaleLayerWeights = layerParameters.protoweights.layer(layerIdWeightsScale);
                
                //check that the weights proto message corresponding to the scale layer is correct
                if (caffeScaleLayerWeights.blobs_size() == 2 &&
                    caffeScaleLayerWeights.blobs(0).data_size() == caffeScaleLayerWeights.blobs(1).data_size()
                    == caffeLayerWeights.blobs(0).data_size()){
                    
                    //All conditions are satisfied: Scale layer can now be fused with the BN layer.
                    fuseScale = true;
                    TopName = caffeScaleLayer.top(0);
                    gamma = caffeScaleLayerWeights.blobs(0).data();
                    beta = caffeScaleLayerWeights.blobs(1).data();
                    (*layerParameters.layerId)++;
                    //Succesfully fused batchNorm and scale layers.
                    
                }
            }
        }
    }
    
    #pragma unused(gamma)
    #pragma unused(beta)
    
    //Write Layer metadata
    ::google::protobuf::RepeatedPtrField< ::CoreML::Specification::NeuralNetworkLayer >* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    bottom.push_back(caffeLayer.bottom(0));
    top.push_back(TopName);
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    
    Specification::BatchnormLayerParams* specLayerParams = specLayer->mutable_batchnorm();
    const caffe::BatchNormParameter& caffeLayerParamsBN = caffeLayer.batch_norm_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerWeights.blobs_size()!=3) {
        CoreMLConverter::errorInCaffeProto("Must have 3 weight blobs for mean, variance and scale",caffeLayer.name(),"BatchNorm");
    }
    if (!caffeLayerParamsBN.use_global_stats()){
        /*
         WARNING: BatchNorm paramater 'use_global_stats' is False. It will be ignored during inference.
        The converter will look for mean/variance weights anyways. If they are not found, it will error out.
        */
    }
    //***************************************************************
    
    int C = caffeLayerWeights.blobs(0).data_size();
    int varianceLength = caffeLayerWeights.blobs(1).data_size();
    
    //****Some error checking in caffe file*************************
    if (C == 0){
        CoreMLConverter::errorInCaffeProto("Empty mean vector blob",caffeLayer.name(),"BatchNorm");
    }
    if (varianceLength == 0){
        CoreMLConverter::errorInCaffeProto("Empty variance vector blob",caffeLayer.name(),"BatchNorm");
    }
    if (varianceLength != C){
        CoreMLConverter::errorInCaffeProto("Lengths of mean/variance vectors do not match",caffeLayer.name(),"BatchNorm");
    }
    if (caffeLayerWeights.blobs(2).data_size() == 0){
        CoreMLConverter::errorInCaffeProto("Empty scale factor blob",caffeLayer.name(),"BatchNorm");
    }
    //***************************************************************
    
    specLayerParams->set_epsilon(caffeLayerParamsBN.eps());
    assert(C >= 0);
    specLayerParams->set_channels(static_cast<uint64_t>(C));
    float scale = caffeLayerWeights.blobs(2).data(0);
    float multiplicativeScale = (scale < 1e-5f) ? 0 : 1/scale;
    ::google::protobuf::RepeatedField<float> mean = caffeLayerWeights.blobs(0).data();
    ::google::protobuf::RepeatedField<float> variance = caffeLayerWeights.blobs(1).data();
    ::google::protobuf::RepeatedField<float>* meanWrite = specLayerParams->mutable_mean()->mutable_floatvalue();
    ::google::protobuf::RepeatedField<float>* varianceWrite = specLayerParams->mutable_variance()->mutable_floatvalue();
    ::google::protobuf::RepeatedField<float>* gammaWrite = specLayerParams->mutable_gamma()->mutable_floatvalue();
    ::google::protobuf::RepeatedField<float>* betaWrite = specLayerParams->mutable_beta()->mutable_floatvalue();
    meanWrite->Resize(C, 0.0);
    varianceWrite->Resize(C, 0.0);
    gammaWrite->Resize(C, 0.0);
    betaWrite->Resize(C, 0.0);
    for (int i=0; i<C; i++){
        meanWrite->Set(i,mean[i] * multiplicativeScale);
        varianceWrite->Set(i,variance[i] * multiplicativeScale);
        if (fuseScale){
            gammaWrite->Set(i, gamma[i]);
            betaWrite->Set(i, beta[i]);
        } else{
            gammaWrite->Set(i,1.0);
            betaWrite->Set(i,0.0);
        }
    }
}